

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int getLockingMode(char *z)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  
  if (z == (char *)0x0) {
    return -1;
  }
  lVar3 = 0;
  do {
    bVar1 = z[lVar3];
    bVar2 = "exclusive"[lVar3];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) break;
    }
    else if (""[bVar1] != ""[bVar2]) break;
    lVar3 = lVar3 + 1;
  } while( true );
  if (bVar1 == bVar2) {
    return 1;
  }
  lVar3 = 0;
  do {
    bVar1 = z[lVar3];
    bVar2 = "normal"[lVar3];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) goto LAB_0019c19e;
    }
    else if (""[bVar1] != ""[bVar2]) {
LAB_0019c19e:
      if (bVar1 != bVar2) {
        return -1;
      }
      return 0;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static int getLockingMode(const char *z){
  if( z ){
    if( 0==sqlite3StrICmp(z, "exclusive") ) return PAGER_LOCKINGMODE_EXCLUSIVE;
    if( 0==sqlite3StrICmp(z, "normal") ) return PAGER_LOCKINGMODE_NORMAL;
  }
  return PAGER_LOCKINGMODE_QUERY;
}